

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O2

bool google::protobuf::compiler::cpp::CanInitializeByZeroing(FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  EnumValueDescriptor *pEVar3;
  byte bVar4;
  
  if (((byte)field[1] & 8) != 0 || (~(byte)field[1] & 0x60) == 0) {
    return false;
  }
  CVar2 = FieldDescriptor::cpp_type(field);
  switch(CVar2) {
  case CPPTYPE_INT32:
  case CPPTYPE_UINT32:
    bVar4 = *(int *)(field + 0x40) == 0;
    break;
  case CPPTYPE_INT64:
  case CPPTYPE_UINT64:
    bVar4 = *(long *)(field + 0x40) == 0;
    break;
  case CPPTYPE_DOUBLE:
    bVar1 = *(double *)(field + 0x40) == 0.0;
    goto LAB_00287af6;
  case CPPTYPE_FLOAT:
    bVar1 = *(float *)(field + 0x40) == 0.0;
LAB_00287af6:
    bVar4 = -bVar1 & 1;
    break;
  case CPPTYPE_BOOL:
    bVar4 = (byte)field[0x40] ^ 1;
    break;
  case CPPTYPE_ENUM:
    pEVar3 = FieldDescriptor::default_value_enum(field);
    bVar4 = *(int *)(pEVar3 + 4) == 0;
    break;
  default:
    bVar4 = 0;
  }
  return (bool)bVar4;
}

Assistant:

inline FieldDescriptor::Label FieldDescriptor::label() const {
  return static_cast<Label>(label_);
}